

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# python_generator.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::python::Generator::PrintMessageDescriptors(Generator *this)

{
  int iVar1;
  long in_RDI;
  int i;
  char *in_stack_00000028;
  Printer *in_stack_00000030;
  Descriptor *in_stack_00000678;
  Generator *in_stack_00000680;
  undefined4 local_c;
  
  local_c = 0;
  while( true ) {
    iVar1 = FileDescriptor::message_type_count(*(FileDescriptor **)(in_RDI + 0x30));
    if (iVar1 <= local_c) break;
    FileDescriptor::message_type(*(FileDescriptor **)(in_RDI + 0x30),local_c);
    PrintDescriptor(in_stack_00000680,in_stack_00000678);
    io::Printer::Print<>(in_stack_00000030,in_stack_00000028);
    local_c = local_c + 1;
  }
  return;
}

Assistant:

void Generator::PrintMessageDescriptors() const {
  for (int i = 0; i < file_->message_type_count(); ++i) {
    PrintDescriptor(*file_->message_type(i));
    printer_->Print("\n");
  }
}